

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::GetLocationPath
          (ServiceDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *this_00;
  int __c;
  char *pcVar1;
  value_type_conflict1 local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  ServiceDescriptor *this_local;
  
  pcVar1 = "\x06";
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  std::vector<int,_std::allocator<int>_>::push_back
            (output,&FileDescriptorProto::kServiceFieldNumber);
  this_00 = local_18;
  pcVar1 = index(this,pcVar1,__c);
  local_1c = (value_type_conflict1)pcVar1;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_1c);
  return;
}

Assistant:

void ServiceDescriptor::GetLocationPath(vector<int>* output) const {
  output->push_back(FileDescriptorProto::kServiceFieldNumber);
  output->push_back(index());
}